

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O0

void __thiscall DIS::ArealObjectStatePdu::marshal(ArealObjectStatePdu *this,DataStream *dataStream)

{
  double dVar1;
  size_type sVar2;
  double dVar3;
  const_reference pvVar4;
  undefined1 local_40 [8];
  Vector3Double x;
  size_t idx;
  DataStream *dataStream_local;
  ArealObjectStatePdu *this_local;
  
  SyntheticEnvironmentFamilyPdu::marshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::marshal(&this->_objectID,dataStream);
  EntityID::marshal(&this->_referencedObjectID,dataStream);
  DataStream::operator<<(dataStream,this->_updateNumber);
  DataStream::operator<<(dataStream,this->_forceID);
  DataStream::operator<<(dataStream,this->_modifications);
  EntityType::marshal(&this->_objectType,dataStream);
  SixByteChunk::marshal(&this->_objectAppearance,dataStream);
  sVar2 = std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::size
                    (&this->_objectLocation);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  SimulationAddress::marshal(&this->_requesterID,dataStream);
  SimulationAddress::marshal(&this->_receivingID,dataStream);
  x._z = 0.0;
  while( true ) {
    dVar1 = x._z;
    dVar3 = (double)std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::size
                              (&this->_objectLocation);
    if ((ulong)dVar3 <= (ulong)dVar1) break;
    pvVar4 = std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::operator[]
                       (&this->_objectLocation,(size_type)x._z);
    Vector3Double::Vector3Double((Vector3Double *)local_40,pvVar4);
    Vector3Double::marshal((Vector3Double *)local_40,dataStream);
    Vector3Double::~Vector3Double((Vector3Double *)local_40);
    x._z = (double)((long)x._z + 1);
  }
  return;
}

Assistant:

void ArealObjectStatePdu::marshal(DataStream& dataStream) const
{
    SyntheticEnvironmentFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _objectID.marshal(dataStream);
    _referencedObjectID.marshal(dataStream);
    dataStream << _updateNumber;
    dataStream << _forceID;
    dataStream << _modifications;
    _objectType.marshal(dataStream);
    _objectAppearance.marshal(dataStream);
    dataStream << ( unsigned short )_objectLocation.size();
    _requesterID.marshal(dataStream);
    _receivingID.marshal(dataStream);

     for(size_t idx = 0; idx < _objectLocation.size(); idx++)
     {
        Vector3Double x = _objectLocation[idx];
        x.marshal(dataStream);
     }

}